

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

pair<const_void_*,_int> __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindSymbolOnlyFlat
          (DescriptorIndex *this,StringPiece name)

{
  pointer pEVar1;
  StringPiece super_symbol;
  StringPiece sub_symbol;
  bool bVar2;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  _Var3;
  void *pvVar4;
  int iVar5;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  this_00;
  pair<const_void_*,_int> pVar6;
  StringPiece local_58;
  string local_48;
  
  local_58.length_ = name.length_;
  local_58.ptr_ = name.ptr_;
  _Var3 = std::
          __upper_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::stringpiece_internal::StringPiece,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
                    ((this->by_symbol_flat_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->by_symbol_flat_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_58,
                     (_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                      )(this->by_symbol_)._M_t._M_impl.
                       super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                       ._M_key_compare.index);
  this_00._M_current = _Var3._M_current + -1;
  if (_Var3._M_current ==
      (this->by_symbol_flat_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = _Var3;
  }
  if (this_00._M_current ==
      (this->by_symbol_flat_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar4 = (void *)0x0;
    iVar5 = 0;
  }
  else {
    SymbolEntry::AsString_abi_cxx11_(&local_48,this_00._M_current,this);
    sub_symbol.length_ = local_48._M_string_length;
    sub_symbol.ptr_ = local_48._M_dataplus._M_p;
    if ((long)local_48._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_48._M_string_length,"string length exceeds max size");
    }
    super_symbol.length_ = local_58.length_;
    super_symbol.ptr_ = local_58.ptr_;
    bVar2 = anon_unknown_31::IsSubSymbol(sub_symbol,super_symbol);
    if (bVar2) {
      pEVar1 = (this->all_values_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = pEVar1[(this_00._M_current)->data_offset].data;
      iVar5 = pEVar1[(this_00._M_current)->data_offset].size;
    }
    else {
      pvVar4 = (void *)0x0;
      iVar5 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  pVar6.second = iVar5;
  pVar6.first = pvVar4;
  pVar6._12_4_ = 0;
  return pVar6;
}

Assistant:

std::pair<const void*, int>
EncodedDescriptorDatabase::DescriptorIndex::FindSymbolOnlyFlat(
    StringPiece name) const {
  auto iter =
      FindLastLessOrEqual(&by_symbol_flat_, name, by_symbol_.key_comp());

  return iter != by_symbol_flat_.end() &&
                 IsSubSymbol(iter->AsString(*this), name)
             ? all_values_[iter->data_offset].value()
             : Value();
}